

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::ZmpTrackingGainEstimator::ZmpTrackingGainEstimator
          (ZmpTrackingGainEstimator *this,double dt,Vector2 *zmpMeasureErrorStd,
          Vector3 *gainDriftPerSecond,Vector2 *zmpProcessErrorStd,double minimumGain,
          Vector2 *initZMP,Vector3 *initGain,Vector2 *initZMPUncertainty,
          Vector3 *initGainUncertainty)

{
  double *pdVar1;
  double dVar2;
  ActualDstType actualDst;
  Matrix4 *pMVar3;
  ulong uVar4;
  long lVar5;
  ActualDstType actualDst_1;
  Matrix2 local_58;
  Rotation2D<double> local_38;
  
  this->dt_ = dt;
  this->minimumGain_ = minimumGain;
  dVar2 = (zmpMeasureErrorStd->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
          m_storage.m_data.array[1];
  (this->zmpMeasureErrorstd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
  .m_data.array[0] =
       (zmpMeasureErrorStd->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
       m_data.array[0];
  (this->zmpMeasureErrorstd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
  .m_data.array[1] = dVar2;
  dVar2 = (gainDriftPerSecond->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1];
  (this->gainDriftPerSecondStd_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] =
       (gainDriftPerSecond->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
       m_data.array[0];
  (this->gainDriftPerSecondStd_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = dVar2;
  (this->gainDriftPerSecondStd_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] =
       (gainDriftPerSecond->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
       m_data.array[2];
  dVar2 = (zmpProcessErrorStd->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).
          m_storage.m_data.array[1];
  (this->zmpProcessErrorStd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
  .m_data.array[0] =
       (zmpProcessErrorStd->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
       m_data.array[0];
  (this->zmpProcessErrorStd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
  .m_data.array[1] = dVar2;
  KalmanFilterBase::KalmanFilterBase(&(this->filter_).super_KalmanFilterBase,5,2,0);
  (this->filter_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
  _vptr_ObserverBase = (_func_int **)&PTR__LinearKalmanFilter_001b4368;
  (this->filter_).super_KalmanFilterBase.super_StateVectorArithmetics._vptr_StateVectorArithmetics =
       (_func_int **)&PTR_stateSum_001b45c8;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->filter_).d_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->filter_).b_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  pMVar3 = &this->A_;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10]
       = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xb] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xc] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xd] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xe] = 0.0;
  (this->A_).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xf] = 0.0;
  lVar5 = 0x340;
  do {
    (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0]
         = 1.0;
    lVar5 = lVar5 + 0x20;
    pMVar3 = (Matrix4 *)
             ((pMVar3->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.
              m_data.array + 5);
  } while (lVar5 != 0x3c0);
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[0]
       = 1.0;
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[2]
       = 0.0;
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[3]
       = 1.0;
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[4]
       = 0.0;
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[6]
       = 0.0;
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[7]
       = 0.0;
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[8]
       = 0.0;
  (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.m_data.array[9]
       = 0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] =
       0.0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
       0.0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_58,10,2,5);
  if ((local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
       [1] != 9.88131291682493e-324) ||
     (local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
      [2] != 2.47032822920623e-323)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_58,10,2,5);
    if ((local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
         array[1] != 9.88131291682493e-324) ||
       (local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
        [2] != 2.47032822920623e-323)) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 2, 5>, T1 = double, T2 = double]"
                   );
    }
  }
  uVar4 = 0xfffffffffffffffe;
  do {
    pdVar1 = (this->C_).super_PlainObjectBase<Eigen::Matrix<double,_2,_5,_0,_2,_5>_>.m_storage.
             m_data.array + uVar4 + 2;
    dVar2 = pdVar1[1];
    *(double *)
     ((long)local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] + (uVar4 + 2) * 8) = *pdVar1;
    ((double *)
    ((long)local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
           array[0] + (uVar4 + 2) * 8))[1] = dVar2;
    uVar4 = uVar4 + 2;
  } while (uVar4 < 8);
  KalmanFilterBase::setC(&(this->filter_).super_KalmanFilterBase,(Cmatrix *)&local_58);
  free((void *)local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
               m_data.array[0]);
  memset(&this->Q_,0,200);
  local_38.m_angle = 0.0;
  Eigen::Rotation2D<double>::toRotationMatrix(&local_58,&local_38);
  resetWithMeasurements(this,initZMP,initGain,&local_58,initZMPUncertainty,initGainUncertainty);
  return;
}

Assistant:

ZmpTrackingGainEstimator::ZmpTrackingGainEstimator(double dt,
                                                   const Vector2 & zmpMeasureErrorStd,
                                                   const Vector3 & gainDriftPerSecond,
                                                   const Vector2 & zmpProcessErrorStd,
                                                   double minimumGain,
                                                   const Vector2 & initZMP,
                                                   const Vector3 & initGain,
                                                   const Vector2 & initZMPUncertainty,
                                                   const Vector3 & initGainUncertainty)
: dt_(dt), minimumGain_(minimumGain), zmpMeasureErrorstd_(zmpMeasureErrorStd),
  gainDriftPerSecondStd_(gainDriftPerSecond), zmpProcessErrorStd_(zmpProcessErrorStd), filter_(5, 2, 0)
{
  A_.setIdentity();
  C_.topLeftCorner<2, 2>().setIdentity();
  C_.bottomRightCorner<2, 3>().setZero();
  filter_.setC(C_);
  Q_.setZero();
  resetWithMeasurements(initZMP, initGain, 0., initZMPUncertainty, initGainUncertainty);
}